

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::ResultBuilder::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,ResultBuilder *this)

{
  undefined8 *puVar1;
  string *__lhs;
  string *__lhs_00;
  string *__rhs;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  ulong *puVar9;
  long *plVar10;
  ulong uVar11;
  _Alloc_hider _Var12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __lhs = &(this->m_exprComponents).op;
  iVar4 = std::__cxx11::string::compare((char *)__lhs);
  if (iVar4 == 0) {
    if ((this->m_exprComponents).lhs._M_string_length != 0) {
      std::operator+(__return_storage_ptr__,__lhs,&(this->m_exprComponents).lhs);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->m_assertionInfo).capturedExpression._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (this->m_assertionInfo).capturedExpression._M_string_length);
    return __return_storage_ptr__;
  }
  iVar4 = std::__cxx11::string::compare((char *)__lhs);
  if (iVar4 == 0) {
    paVar13 = &local_130.field_2;
    pcVar2 = (this->m_exprComponents).lhs._M_dataplus._M_p;
    local_130._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar2,pcVar2 + (this->m_exprComponents).lhs._M_string_length);
    std::__cxx11::string::append((char *)&local_130);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_130,
                                (ulong)(this->m_exprComponents).rhs._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar8) {
      lVar5 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    _Var12._M_p = local_130._M_dataplus._M_p;
LAB_00133a21:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var12._M_p == paVar13) {
      return __return_storage_ptr__;
    }
    goto LAB_00133a26;
  }
  iVar4 = std::__cxx11::string::compare((char *)__lhs);
  if (iVar4 == 0) {
    std::operator+(&local_50,"{can\'t expand - use ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar9 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar9) {
      local_a0 = *puVar9;
      lStack_98 = plVar6[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *puVar9;
      local_b0 = (ulong *)*plVar6;
    }
    local_a8 = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::substr
              ((ulong)&local_90,(ulong)&(this->m_assertionInfo).capturedExpression);
    uVar11 = 0xf;
    if (local_b0 != &local_a0) {
      uVar11 = local_a0;
    }
    if (uVar11 < (ulong)(local_88 + local_a8)) {
      uVar11 = 0xf;
      if (local_90 != local_80) {
        uVar11 = local_80[0];
      }
      if (uVar11 < (ulong)(local_88 + local_a8)) goto LAB_00133ad2;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
    }
    else {
LAB_00133ad2:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
    }
    local_d0 = &local_c0;
    puVar1 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar1) {
      local_c0 = *puVar1;
      uStack_b8 = puVar7[3];
    }
    else {
      local_c0 = *puVar1;
      local_d0 = (undefined8 *)*puVar7;
    }
    local_c8 = puVar7[1];
    *puVar7 = puVar1;
    puVar7[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_60 = *plVar10;
      lStack_58 = plVar6[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar10;
      local_70 = (long *)*plVar6;
    }
    local_68 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_70,(ulong)(this->m_assertionInfo).macroName._M_dataplus._M_p)
    ;
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_f0.field_2._M_allocated_capacity = *psVar8;
      local_f0.field_2._8_8_ = puVar7[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar8;
      local_f0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_f0._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_110.field_2._M_allocated_capacity = *psVar8;
      local_110.field_2._8_8_ = puVar7[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar8;
      local_110._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_110._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_110,
                        (ulong)(this->m_assertionInfo).capturedExpression._M_dataplus._M_p);
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130.field_2._8_8_ = puVar7[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_130._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_130);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar8) {
      lVar5 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    pbVar3 = &local_50;
  }
  else {
    if (0x27 < (this->m_exprComponents).rhs._M_string_length +
               (this->m_exprComponents).lhs._M_string_length) {
LAB_0013376f:
      paVar13 = &local_f0.field_2;
      pcVar2 = (this->m_exprComponents).lhs._M_dataplus._M_p;
      local_f0._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar2,pcVar2 + (this->m_exprComponents).lhs._M_string_length);
      std::__cxx11::string::append((char *)&local_f0);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_f0,
                                  (ulong)(this->m_exprComponents).op._M_dataplus._M_p);
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_110.field_2._M_allocated_capacity = *psVar8;
        local_110.field_2._8_8_ = plVar6[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar8;
        local_110._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_110._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_130.field_2._M_allocated_capacity = *psVar8;
        local_130.field_2._8_8_ = plVar6[3];
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar8;
        local_130._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_130._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_130,
                                  (ulong)(this->m_exprComponents).rhs._M_dataplus._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar8) {
        lVar5 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      _Var12._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
        _Var12._M_p = local_f0._M_dataplus._M_p;
      }
      goto LAB_00133a21;
    }
    __lhs_00 = &(this->m_exprComponents).lhs;
    lVar5 = std::__cxx11::string::find((char *)__lhs_00,0x159b23,0);
    if (lVar5 != -1) goto LAB_0013376f;
    __rhs = &(this->m_exprComponents).rhs;
    lVar5 = std::__cxx11::string::find((char *)__rhs,0x159b23,0);
    if (lVar5 != -1) goto LAB_0013376f;
    std::operator+(&local_f0,__lhs_00," ");
    std::operator+(&local_110,&local_f0,__lhs);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130.field_2._8_8_ = puVar7[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_130._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::operator+(__return_storage_ptr__,&local_130,__rhs);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    pbVar3 = &local_f0;
  }
  _Var12._M_p = (pointer)(&(pbVar3->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var12._M_p == &pbVar3->field_2) {
    return __return_storage_ptr__;
  }
LAB_00133a26:
  operator_delete(_Var12._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string ResultBuilder::reconstructExpression() const {
        if( m_exprComponents.op == "" )
            return m_exprComponents.lhs.empty() ? m_assertionInfo.capturedExpression : m_exprComponents.op + m_exprComponents.lhs;
        else if( m_exprComponents.op == "matches" )
            return m_exprComponents.lhs + " " + m_exprComponents.rhs;
        else if( m_exprComponents.op != "!" ) {
            if( m_exprComponents.lhs.size() + m_exprComponents.rhs.size() < 40 &&
                m_exprComponents.lhs.find("\n") == std::string::npos &&
                m_exprComponents.rhs.find("\n") == std::string::npos )
                return m_exprComponents.lhs + " " + m_exprComponents.op + " " + m_exprComponents.rhs;
            else
                return m_exprComponents.lhs + "\n" + m_exprComponents.op + "\n" + m_exprComponents.rhs;
        }
        else
            return "{can't expand - use " + m_assertionInfo.macroName + "_FALSE( " + m_assertionInfo.capturedExpression.substr(1) + " ) instead of " + m_assertionInfo.macroName + "( " + m_assertionInfo.capturedExpression + " ) for better diagnostics}";
    }